

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.cc
# Opt level: O2

bool absl::lts_20250127::container_internal::anon_unknown_2::ShouldRehashForBugDetection
               (ctrl_t *ctrl,size_t capacity)

{
  long lVar1;
  ulong uVar2;
  long *in_FS_OFFSET;
  probe_seq<16UL> local_20;
  
  lVar1 = in_FS_OFFSET[-6];
  in_FS_OFFSET[-6] = lVar1 + 1U;
  uVar2 = (*in_FS_OFFSET - 0x30U ^ (ulong)&hash_internal::MixingHashState::kSeed ^ lVar1 + 1U) *
          -0x234dd359734ecb13;
  probe(&local_20,ctrl,capacity,
        uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
        (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
        (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38);
  return local_20.offset_ < 0x10;
}

Assistant:

bool ShouldRehashForBugDetection(const ctrl_t* ctrl, size_t capacity) {
  // Note: we can't use the abseil-random library because abseil-random
  // depends on swisstable. We want to return true with probability
  // `min(1, RehashProbabilityConstant() / capacity())`. In order to do this,
  // we probe based on a random hash and see if the offset is less than
  // RehashProbabilityConstant().
  return probe(ctrl, capacity, absl::HashOf(RandomSeed())).offset() <
         RehashProbabilityConstant();
}